

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

Map<String,_String> * Process::getEnvironmentVariables(void)

{
  usize *puVar1;
  long lVar2;
  long *plVar3;
  char cVar4;
  usize uVar5;
  Map<String,_String> *in_RDI;
  char *e;
  char *str;
  long lVar6;
  String value;
  String var;
  String local_80;
  String local_58;
  
  (in_RDI->_end).item = &in_RDI->endItem;
  (in_RDI->_begin).item = &in_RDI->endItem;
  in_RDI->root = (Item *)0x0;
  in_RDI->_size = 0;
  (in_RDI->endItem).key.data = &String::emptyData.super_Data;
  (in_RDI->endItem).value.data = &String::emptyData.super_Data;
  (in_RDI->endItem).parent = (Item *)0x0;
  (in_RDI->endItem).next = (Item *)0x0;
  (in_RDI->endItem).prev = (Item *)0x0;
  in_RDI->freeItem = (Item *)0x0;
  in_RDI->blocks = (ItemBlock *)0x0;
  str = (char *)*_environ;
  if (str != (char *)0x0) {
    lVar6 = 0;
    plVar3 = _environ;
    do {
      cVar4 = *str;
      if (cVar4 != '\0') {
        uVar5 = 0;
LAB_0010a986:
        if (cVar4 != '=') goto code_r0x0010a98b;
        local_58.data = &String::emptyData.super_Data;
        String::attach(&local_58,str,uVar5);
        local_80.data = &String::emptyData.super_Data;
        uVar5 = 0xffffffffffffffff;
        do {
          lVar2 = uVar5 + 2;
          uVar5 = uVar5 + 1;
        } while (str[lVar2] != '\0');
        String::attach(&local_80,str + 1,uVar5);
        Map<String,_String>::insert(in_RDI,&in_RDI->root,(Item *)0x0,&local_58,&local_80);
        if ((local_80.data)->ref != 0) {
          LOCK();
          puVar1 = &(local_80.data)->ref;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          if ((*puVar1 == 0) && (local_80.data != (Data *)0x0)) {
            operator_delete__(local_80.data);
          }
        }
        plVar3 = _environ;
        if ((local_58.data)->ref != 0) {
          LOCK();
          puVar1 = &(local_58.data)->ref;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          plVar3 = _environ;
          if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
            operator_delete__(local_58.data);
            plVar3 = _environ;
          }
        }
      }
LAB_0010aa37:
      str = (char *)plVar3[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (str != (char *)0x0);
  }
  return in_RDI;
code_r0x0010a98b:
  cVar4 = str[uVar5 + 1];
  uVar5 = uVar5 + 1;
  if (cVar4 == '\0') goto LAB_0010aa37;
  goto LAB_0010a986;
}

Assistant:

Map<String, String> Process::getEnvironmentVariables()
{
#ifdef _WIN32
  Map<String, String> result;
  LPTCH environmentStrings = GetEnvironmentStrings();
  if (!environmentStrings)
    return result;
  struct Guard
  {
    LPTCH _environmentStrings;
    ~Guard() { FreeEnvironmentStrings(_environmentStrings); }
  } guard = { environmentStrings };

  for (LPTCH i = environmentStrings; *i != '\0'; ++i)
  {
    String key;
    String value;

    for (; *i != '='; ++i)
      key += *i;
    ++i;
    for (; *i != '\0'; ++i)
        value += *i;

    if (key.isEmpty())
      continue;
    result.insert(key, value);
  }
  return result;
#else
  Map<String, String> result;
  for (size_t i = 0; environ[i]; ++i)
  {
    const char* e = environ[i];
    const char* x = String::find(e, '=');
    if (!x)
      continue;
    String var;
    var.attach(e, x - e);
    String value;
    ++e;
    value.attach(e, String::length(e));
    result.insert(var, value);
  }
  return result;
#endif
}